

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzer.cpp
# Opt level: O0

void __thiscall HdlcAnalyzer::SetupResults(HdlcAnalyzer *this)

{
  HdlcAnalyzerResults *this_00;
  element_type *settings;
  element_type *peVar1;
  HdlcAnalyzer *this_local;
  
  this_00 = (HdlcAnalyzerResults *)operator_new(0x20);
  settings = std::auto_ptr<HdlcAnalyzerSettings>::get(&this->mSettings);
  HdlcAnalyzerResults::HdlcAnalyzerResults(this_00,this,settings);
  std::auto_ptr<HdlcAnalyzerResults>::reset(&this->mResults,this_00);
  std::auto_ptr<HdlcAnalyzerResults>::get(&this->mResults);
  Analyzer::SetAnalyzerResults((AnalyzerResults *)this);
  peVar1 = std::auto_ptr<HdlcAnalyzerResults>::operator->(&this->mResults);
  std::auto_ptr<HdlcAnalyzerSettings>::operator->(&this->mSettings);
  AnalyzerResults::AddChannelBubblesWillAppearOn((Channel *)peVar1);
  return;
}

Assistant:

void HdlcAnalyzer::SetupResults()
{
    mResults.reset( new HdlcAnalyzerResults( this, mSettings.get() ) );
    SetAnalyzerResults( mResults.get() );
    mResults->AddChannelBubblesWillAppearOn( mSettings->mInputChannel );
}